

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::addStructBuffArguments
          (HlslParseContext *this,TSourceLoc *loc,TIntermAggregate **aggregate)

{
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *p_Var1;
  long lVar2;
  TIntermediate *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_03;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  TVariable *variable;
  mapped_type_conflict2 *pmVar8;
  long lVar9;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __it;
  int param;
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *this_01;
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *p_Var10;
  long lVar11;
  TIntermSymbol *local_118;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> local_110;
  TString counterBlockName;
  TType counterType;
  undefined4 extraout_var_02;
  
  __it._M_current = (TIntermNode **)loc;
  iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  this_01 = *(_Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
              **)(CONCAT44(extraout_var,iVar4) + 8);
  iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  p_Var1 = *(_Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
             **)(CONCAT44(extraout_var_00,iVar4) + 0x10);
  lVar11 = (long)p_Var1 - (long)this_01;
  for (lVar9 = lVar11 >> 5; p_Var10 = this_01, 0 < lVar9; lVar9 = lVar9 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01,__it);
    if (bVar3) goto LAB_00321d67;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01 + 8,__it);
    p_Var10 = this_01 + 8;
    if (bVar3) goto LAB_00321d67;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01 + 0x10,__it);
    p_Var10 = this_01 + 0x10;
    if (bVar3) goto LAB_00321d67;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01 + 0x18,__it);
    p_Var10 = this_01 + 0x18;
    if (bVar3) goto LAB_00321d67;
    this_01 = this_01 + 0x20;
    lVar11 = lVar11 + -0x20;
  }
  lVar11 = lVar11 >> 3;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      if (lVar11 != 3) {
        return;
      }
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01,__it);
      if (bVar3) goto LAB_00321d67;
      this_01 = this_01 + 8;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01,__it);
    p_Var10 = this_01;
    if (bVar3) goto LAB_00321d67;
    this_01 = this_01 + 8;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
          ::operator()(this_01,__it);
  p_Var10 = this_01;
  if (!bVar3) {
    p_Var10 = p_Var1;
  }
LAB_00321d67:
  if (p_Var10 != p_Var1) {
    TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)&local_110);
    lVar9 = 0;
    lVar11 = 0;
    while( true ) {
      iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      lVar7 = *(long *)(CONCAT44(extraout_var_01,iVar4) + 0x10);
      lVar2 = *(long *)(CONCAT44(extraout_var_01,iVar4) + 8);
      iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      lVar5 = CONCAT44(extraout_var_02,iVar4);
      if ((int)((ulong)(lVar7 - lVar2) >> 3) <= lVar11) break;
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                (&local_110,(value_type *)(*(long *)(lVar5 + 8) + lVar9));
      iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      plVar6 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_03,iVar4) + 8) +
                                               lVar9) + 0x18))();
      plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))(plVar6);
      lVar7 = (**(code **)(*plVar6 + 0x58))(plVar6);
      if ((*(uint *)(lVar7 + 8) & 0x1fe0000) == 0x960000) {
        iVar4 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        plVar6 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_04,iVar4) + 8) +
                                                 lVar9) + 0x60))();
        if (plVar6 != (long *)0x0) {
          TType::TType(&counterType,EbtVoid,EvqTemporary,1,0,0,false);
          counterBufferType(this,loc,&counterType);
          this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*plVar6 + 400))(plVar6);
          TIntermediate::
          addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
                    (&counterBlockName,this_00,name);
          variable = makeInternalVariable(this,counterBlockName._M_dataplus._M_p,&counterType);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                   ::operator[](&(this->structBufferCounter).
                                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                                ,&counterBlockName);
          *pmVar8 = true;
          local_118 = TIntermediate::addSymbol
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 variable,loc);
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&local_110,
                     (TIntermNode **)&local_118);
        }
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 8;
    }
    *(pointer *)(lVar5 + 8) =
         local_110.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(lVar5 + 0x10) =
         local_110.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(lVar5 + 0x18) =
         local_110.super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return;
}

Assistant:

void HlslParseContext::addStructBuffArguments(const TSourceLoc& loc, TIntermAggregate*& aggregate)
{
    // See if there are any SB types with counters.
    const bool hasStructBuffArg =
        std::any_of(aggregate->getSequence().begin(),
                    aggregate->getSequence().end(),
                    [this](const TIntermNode* node) {
                        return (node && node->getAsTyped() != nullptr) && hasStructBuffCounter(node->getAsTyped()->getType());
                    });

    // Nothing to do, if we didn't find one.
    if (! hasStructBuffArg)
        return;

    TIntermSequence argsWithCounterBuffers;

    for (int param = 0; param < int(aggregate->getSequence().size()); ++param) {
        argsWithCounterBuffers.push_back(aggregate->getSequence()[param]);

        if (hasStructBuffCounter(aggregate->getSequence()[param]->getAsTyped()->getType())) {
            const TIntermSymbol* blockSym = aggregate->getSequence()[param]->getAsSymbolNode();
            if (blockSym != nullptr) {
                TType counterType;
                counterBufferType(loc, counterType);

                const TString counterBlockName(intermediate.addCounterBufferName(blockSym->getName()));

                TVariable* variable = makeInternalVariable(counterBlockName, counterType);

                // Mark this buffer's counter block as being in use
                structBufferCounter[counterBlockName] = true;

                TIntermSymbol* sym = intermediate.addSymbol(*variable, loc);
                argsWithCounterBuffers.push_back(sym);
            }
        }
    }

    // Swap with the temp list we've built up.
    aggregate->getSequence().swap(argsWithCounterBuffers);
}